

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::ReadInputStream(FILE *fin)

{
  double dVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  
  sVar2 = fread(&sh,0xc,1,(FILE *)fin);
  do {
    if (sVar2 == 0) {
      return;
    }
    pmVar3 = std::__detail::
             _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)eventToWeighting_,&sh.event_id);
    dVar1 = *pmVar3;
    sVar2 = 1;
    while (sVar2 != 0) {
      sVar2 = fread(&sr,8,1,(FILE *)fin);
      if (1 < sr.sidx + 5U) {
        if ((sVar2 == 0) || (sr.sidx == 0)) break;
        bVar6 = sr.sidx != -1;
        iVar5 = 1;
        if (bVar6) {
          iVar5 = sampleSize_;
        }
        dVar7 = (double)sr.loss;
        pmVar4 = std::
                 map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                 ::operator[]((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                               *)means_,&sh.summary_id);
        pmVar4->_M_elems[bVar6] = (dVar7 * dVar1) / (double)iVar5 + pmVar4->_M_elems[bVar6];
      }
    }
    sVar2 = fread(&sh,0xc,1,(FILE *)fin);
  } while( true );
}

Assistant:

inline void ReadInputStream(FILE *fin) {

    summarySampleslevelHeader sh;
    size_t i = fread(&sh, sizeof(sh), 1, fin);
    while (i != 0) {

      double weight = eventToWeighting_[sh.event_id];

      while (i != 0) {

        sampleslevelRec sr;
        i = fread(&sr, sizeof(sr), 1, fin);

        if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
        if (i == 0 || sr.sidx == 0) break;

        means_[sh.summary_id][sr.sidx != -1] += (sr.loss * weight / (1 + (sampleSize_ - 1) * (sr.sidx != -1)));

      }

      i = fread(&sh, sizeof(sh), 1, fin);

    }

  }